

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

void auto_arima_setMethod(auto_arima_object obj,int value)

{
  if (value == 2) {
    obj->method = 2;
  }
  else if (value == 1) {
    obj->method = 1;
  }
  else {
    if (value != 0) {
      puts("\n Acceptable Numerical Values 0 - CSS-MLE, 1 - MLE, 2 - CSS ");
      return;
    }
    obj->method = 0;
  }
  return;
}

Assistant:

void auto_arima_setMethod(auto_arima_object obj, int value) {
	if (value == 0) {
		obj->method = 0;
	}
	else if (value == 1) {
		obj->method = 1;
	}
	else if (value == 2) {
		obj->method = 2;
	}
	else {
		printf("\n Acceptable Numerical Values 0 - CSS-MLE, 1 - MLE, 2 - CSS \n");
	}
}